

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_master_table_read(ion_dictionary_config_info_t *config,long where)

{
  int iVar1;
  long __off;
  size_t sVar2;
  long old_pos;
  long where_local;
  ion_dictionary_config_info_t *config_local;
  
  __off = ftell((FILE *)ion_master_table_file);
  old_pos = where;
  if (where == -1) {
    old_pos = (long)(int)(config->id * 0x1a);
  }
  iVar1 = fseek((FILE *)ion_master_table_file,old_pos,0);
  if (iVar1 == 0) {
    sVar2 = fread(config,4,1,(FILE *)ion_master_table_file);
    if (sVar2 == 1) {
      sVar2 = fread(&config->use_type,1,1,(FILE *)ion_master_table_file);
      if (sVar2 == 1) {
        sVar2 = fread(&config->type,4,1,(FILE *)ion_master_table_file);
        if (sVar2 == 1) {
          sVar2 = fread(&config->key_size,4,1,(FILE *)ion_master_table_file);
          if (sVar2 == 1) {
            sVar2 = fread(&config->value_size,4,1,(FILE *)ion_master_table_file);
            if (sVar2 == 1) {
              sVar2 = fread(&config->dictionary_size,4,1,(FILE *)ion_master_table_file);
              if (sVar2 == 1) {
                sVar2 = fread(&config->dictionary_type,4,1,(FILE *)ion_master_table_file);
                if (sVar2 == 1) {
                  sVar2 = fread(&config->dictionary_status,1,1,(FILE *)ion_master_table_file);
                  if (sVar2 == 1) {
                    iVar1 = fseek((FILE *)ion_master_table_file,__off,0);
                    if (iVar1 == 0) {
                      if (config->id == 0) {
                        config_local._7_1_ = '\x01';
                      }
                      else {
                        config_local._7_1_ = '\0';
                      }
                    }
                    else {
                      config_local._7_1_ = '\r';
                    }
                  }
                  else {
                    config_local._7_1_ = '\b';
                  }
                }
                else {
                  config_local._7_1_ = '\b';
                }
              }
              else {
                config_local._7_1_ = '\b';
              }
            }
            else {
              config_local._7_1_ = '\b';
            }
          }
          else {
            config_local._7_1_ = '\b';
          }
        }
        else {
          config_local._7_1_ = '\b';
        }
      }
      else {
        config_local._7_1_ = '\b';
      }
    }
    else {
      config_local._7_1_ = '\b';
    }
  }
  else {
    config_local._7_1_ = '\r';
  }
  return config_local._7_1_;
}

Assistant:

ion_err_t
ion_master_table_read(
	ion_dictionary_config_info_t	*config,
	long							where
) {
	long old_pos = ftell(ion_master_table_file);

	if (ION_MASTER_TABLE_CALCULATE_POS == where) {
		where = (int) (config->id * ION_MASTER_TABLE_RECORD_SIZE(config));
	}

	if (0 != fseek(ion_master_table_file, where, SEEK_SET)) {
		return err_file_bad_seek;
	}

	if (1 != fread(&(config->id), sizeof(config->id), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->use_type), sizeof(config->use_type), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->type), sizeof(config->type), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->key_size), sizeof(config->key_size), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->value_size), sizeof(config->value_size), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->dictionary_size), sizeof(config->dictionary_size), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->dictionary_type), sizeof(config->dictionary_type), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (1 != fread(&(config->dictionary_status), sizeof(config->dictionary_status), 1, ion_master_table_file)) {
		return err_file_read_error;
	}

	if (0 != fseek(ion_master_table_file, old_pos, SEEK_SET)) {
		return err_file_bad_seek;
	}

	if (0 == config->id) {
		return err_item_not_found;
	}

	return err_ok;
}